

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::save(Dictionary *this,ostream *out)

{
  long lVar1;
  long lVar2;
  entry e;
  entry local_108;
  
  std::ostream::write((char *)out,(long)&this->size_);
  std::ostream::write((char *)out,(long)&this->nwords_);
  std::ostream::write((char *)out,(long)&this->nlabels_);
  std::ostream::write((char *)out,(long)&this->ntokens_);
  if (0 < this->size_) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      entry::entry(&local_108,
                   (entry *)((long)&(((this->words_).
                                      super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->word)._M_dataplus.
                                    _M_p + lVar1));
      std::ostream::write((char *)out,(long)local_108.word._M_dataplus._M_p);
      std::ostream::put((char)out);
      std::ostream::write((char *)out,(long)&local_108.count);
      std::ostream::write((char *)out,(long)&local_108.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.actual_word._M_dataplus._M_p != &local_108.actual_word.field_2) {
        operator_delete(local_108.actual_word._M_dataplus._M_p);
      }
      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector
                (&local_108.submorph);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.sublemma.subword._M_dataplus._M_p != &local_108.sublemma.subword.field_2) {
        operator_delete(local_108.sublemma.subword._M_dataplus._M_p);
      }
      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector
                (&local_108.subipangram);
      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector
                (&local_108.subngram);
      if (local_108.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.word._M_dataplus._M_p != &local_108.word.field_2) {
        operator_delete(local_108.word._M_dataplus._M_p);
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0xd8;
    } while (lVar2 < this->size_);
  }
  return;
}

Assistant:

void Dictionary::save(std::ostream& out) const {
  out.write((char*) &size_, sizeof(int32_t));
  out.write((char*) &nwords_, sizeof(int32_t));
  out.write((char*) &nlabels_, sizeof(int32_t));
  out.write((char*) &ntokens_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    entry e = words_[i];
    out.write(e.word.data(), e.word.size() * sizeof(char));
    out.put(0);
    out.write((char*) &(e.count), sizeof(int64_t));
    out.write((char*) &(e.type), sizeof(entry_type));
  }
}